

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ComparisonTestT<short>(void)

{
  ComparisonTestTU<short,char>();
  ComparisonTestTU<short,signed_char>();
  ComparisonTestTU<short,unsigned_char>();
  ComparisonTestTU<short,short>();
  ComparisonTestTU<short,unsigned_short>();
  ComparisonTestTU<short,int>();
  ComparisonTestTU<short,unsigned_int>();
  ComparisonTestTU<short,long>();
  ComparisonTestTU<short,unsigned_long>();
  ComparisonTestTU<short,long_long>();
  ComparisonTestTU<short,unsigned_long_long>();
  return;
}

Assistant:

void ComparisonTestT()
	{
		ComparisonTestTU<T, char>();
		ComparisonTestTU<T, signed char>();
		ComparisonTestTU<T, unsigned char>();
		ComparisonTestTU<T, signed short>();
		ComparisonTestTU<T, unsigned short>();
		ComparisonTestTU<T, signed int>();
		ComparisonTestTU<T, unsigned int>();
		ComparisonTestTU<T, signed long>();
		ComparisonTestTU<T, unsigned long>();
		ComparisonTestTU<T, signed long long>();
		ComparisonTestTU<T, unsigned long long>();
	}